

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void euclidean_dist(float64 *out,uint32 *w_idx,uint32 n_top,uint32 n_density,uint32 veclen,
                   vector_t obs,vector_t *mean)

{
  double local_60;
  float64 worst;
  float64 dist;
  float64 diff;
  vector_t m;
  uint local_38;
  uint32 k;
  uint32 j;
  uint32 i;
  vector_t obs_local;
  uint32 veclen_local;
  uint32 n_density_local;
  uint32 n_top_local;
  uint32 *w_idx_local;
  float64 *out_local;
  
  for (k = 0; k < n_top; k = k + 1) {
    out[k] = 1.8e+307;
  }
  local_60 = (double)out[n_top - 1];
  k = 0;
  do {
    if (n_density <= k) {
      return;
    }
    worst = 0.0;
    for (local_38 = 0; local_38 < veclen && (double)worst < local_60; local_38 = local_38 + 1) {
      worst = (float64)((double)(obs[local_38] - mean[k][local_38]) *
                        (double)(obs[local_38] - mean[k][local_38]) + (double)worst);
    }
    if ((double)worst < local_60) {
      for (local_38 = 0; (local_38 < n_top && ((double)out[local_38] <= (double)worst));
          local_38 = local_38 + 1) {
      }
      for (m._4_4_ = n_top - 1; local_38 < m._4_4_; m._4_4_ = m._4_4_ - 1) {
        out[m._4_4_] = out[m._4_4_ - 1];
        w_idx[m._4_4_] = w_idx[m._4_4_ - 1];
      }
      if (local_38 != m._4_4_) {
        __assert_fail("j == k",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x463,
                      "void euclidean_dist(float64 *, uint32 *, uint32, uint32, uint32, vector_t, vector_t *)"
                     );
      }
      out[m._4_4_] = worst;
      w_idx[m._4_4_] = k;
      local_60 = (double)out[n_top - 1];
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void
euclidean_dist(float64 *out,
	       uint32 *w_idx,
	       uint32 n_top,
	       uint32 n_density,
	       uint32 veclen,
	       vector_t obs,
	       vector_t *mean)
{
    uint32 i, j, k;
    vector_t m;
    float64 diff;
    float64 dist;
    float64 worst;	/* worst density value of the top N density values
			   seen so far */

    for (i = 0; i < n_top; i++) {
	out[i] = MAX_IEEE_NORM_POS_FLOAT64;
    }

    worst = out[n_top-1];

    for (i = 0; i < n_density; i++) {
	m = mean[i];

	dist = 0;

	for (j = 0; (j < veclen) && (dist < worst); j++) {
	    diff = obs[j] - m[j];
	    dist += diff * diff;
	}

	if (dist < worst) {
	    /* codeword i is closer to observation than the worst seen */

	    /* find the insertion point for the new codeword & distance */
	    for (j = 0; j < n_top; j++)
		if (dist < out[j])
		    break;
	    
	    /* make room for the new entry */
	    for (k = n_top-1; k > j; k--) {
		out[k] = out[k-1];
		w_idx[k] = w_idx[k-1];
	    }

	    assert(j == k);

	    /* insert the new distance */
	    out[k] = dist;
	    w_idx[k] = i;

	    worst = out[n_top-1];
	}
    }
}